

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::Shape
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> local_d8;
  long alStack_b8 [4];
  TPZVec<double> *local_98;
  TPZFMatrix<double> *local_90;
  TPZFMatrix<double> *local_88;
  TPZVec<int> local_80;
  int aiStack_60 [12];
  
  local_98 = pt;
  local_90 = phi;
  local_88 = dphi;
  TPZVec<long>::TPZVec(&local_d8,0);
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a0548;
  local_d8.fStore = alStack_b8;
  local_d8.fNElements = 4;
  local_d8.fNAlloc = 0;
  alStack_b8[0] = 0;
  alStack_b8[1] = 0;
  alStack_b8[2] = 0;
  alStack_b8[3] = 0;
  TPZVec<int>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019819b0;
  local_80.fNElements = 0xb;
  local_80.fNAlloc = 0;
  aiStack_60[0] = 0;
  aiStack_60[1] = 0;
  aiStack_60[2] = 0;
  aiStack_60[3] = 0;
  aiStack_60[4] = 0;
  aiStack_60[5] = 0;
  aiStack_60[6] = 0;
  aiStack_60[7] = 0;
  aiStack_60[8] = 0;
  aiStack_60[9] = 0;
  aiStack_60[10] = 0;
  local_80.fStore = aiStack_60;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar3 = 0;
  do {
    pTVar1 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    local_d8.fStore[lVar3] = (long)pTVar1->fId;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,(int)lVar3 + 4);
    local_80.fStore[lVar3] = (uint)*(byte *)(lVar2 + 0x14);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xb);
  pzshape::TPZShapeTetra::Shape(local_98,&local_d8,&local_80,local_90,local_88);
  if (local_80.fStore == aiStack_60) {
    local_80.fStore = (int *)0x0;
  }
  local_80.fNAlloc = 0;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_80.fStore != (int *)0x0) {
    operator_delete__(local_80.fStore);
  }
  if (local_d8.fStore == alStack_b8) {
    local_d8.fStore = (long *)0x0;
  }
  local_d8.fNAlloc = 0;
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_d8.fStore != (long *)0x0) {
    operator_delete__(local_d8.fStore);
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}